

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_netstd_generator.cc
# Opt level: O2

void __thiscall t_netstd_generator::generate_enum(t_netstd_generator *this,t_enum *tenum)

{
  int expected;
  int iVar1;
  undefined4 extraout_var;
  int __oflag;
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_> *out;
  string f_enum_name;
  ofstream_with_content_based_conditional_update f_enum;
  allocator local_1f9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_> local_1b8;
  
  expected = (this->super_t_oop_generator).super_t_generator.indent_;
  std::operator+(&local_1f8,&this->namespace_dir_,"/");
  iVar1 = (*(tenum->super_t_type).super_t_doc._vptr_t_doc[3])(tenum);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1b8,
                 &local_1f8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(extraout_var,iVar1));
  std::operator+(&local_1d8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1b8,
                 ".cs");
  std::__cxx11::string::~string((string *)&local_1b8);
  std::__cxx11::string::~string((string *)&local_1f8);
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::
  template_ofstream_with_content_based_conditional_update(&local_1b8);
  std::__cxx11::string::string((string *)&local_1f8,local_1d8._M_dataplus._M_p,&local_1f9);
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::open
            (&local_1b8,(char *)&local_1f8,__oflag);
  std::__cxx11::string::~string((string *)&local_1f8);
  out = &local_1b8;
  generate_enum(this,(ostream *)out,tenum);
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::close
            (&local_1b8,(int)out);
  t_generator::indent_validate((t_generator *)this,expected,"generate_enum");
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::
  ~template_ofstream_with_content_based_conditional_update(&local_1b8);
  std::__cxx11::string::~string((string *)&local_1d8);
  return;
}

Assistant:

void t_netstd_generator::generate_enum(t_enum* tenum)
{
    int ic = indent_count();
    string f_enum_name = namespace_dir_ + "/" + tenum->get_name() + ".cs";

    ofstream_with_content_based_conditional_update f_enum;
    f_enum.open(f_enum_name.c_str());

    generate_enum(f_enum, tenum);

    f_enum.close();
    indent_validate(ic, "generate_enum");
}